

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O0

int x509v3_cache_extensions(X509 *x)

{
  ulong uVar1;
  BASIC_CONSTRAINTS *data;
  int iVar2;
  int iVar3;
  EVP_MD *type;
  long lVar4;
  size_t sVar5;
  ASN1_OBJECT *o;
  void *pvVar6;
  ASN1_INTEGER *pAVar7;
  X509_NAME *a;
  X509_NAME *b;
  X509_EXTENSION *ex_00;
  X509_EXTENSION *ex;
  int is_set;
  int j;
  size_t i;
  EXTENDED_KEY_USAGE *extusage;
  ASN1_BIT_STRING *usage;
  BASIC_CONSTRAINTS *bs;
  X509 *x_local;
  
  bs = (BASIC_CONSTRAINTS *)x;
  CRYPTO_MUTEX_lock_read(&x->lock);
  ex._0_4_ = bs[3].ca & 0x100;
  CRYPTO_MUTEX_unlock_read((CRYPTO_MUTEX *)(bs + 9));
  if ((uint)ex == 0) {
    CRYPTO_MUTEX_lock_write((CRYPTO_MUTEX *)(bs + 9));
    data = bs;
    if ((bs[3].ca & 0x100U) == 0) {
      type = EVP_sha256();
      iVar2 = X509_digest((X509 *)data,type,(uchar *)&bs[6].pathlen,(uint *)0x0);
      if (iVar2 == 0) {
        bs[3].ca = bs[3].ca | 0x80;
      }
      lVar4 = X509_get_version((X509 *)bs);
      if (lVar4 == 0) {
        bs[3].ca = bs[3].ca | 0x40;
      }
      usage = (ASN1_BIT_STRING *)X509_get_ext_d2i((X509 *)bs,0x57,(int *)((long)&ex + 4),(int *)0x0)
      ;
      if (usage == (ASN1_BIT_STRING *)0x0) {
        if (ex._4_4_ != -1) {
          bs[3].ca = bs[3].ca | 0x80;
        }
      }
      else {
        if (usage->length != 0) {
          bs[3].ca = bs[3].ca | 0x10;
        }
        if (usage->data == (uchar *)0x0) {
          bs[2].pathlen = (ASN1_INTEGER *)0xffffffffffffffff;
        }
        else if ((*(int *)(usage->data + 4) == 0x102) || (usage->length == 0)) {
          bs[3].ca = bs[3].ca | 0x80;
          bs[2].pathlen = (ASN1_INTEGER *)0x0;
        }
        else {
          pAVar7 = (ASN1_INTEGER *)ASN1_INTEGER_get((ASN1_INTEGER *)usage->data);
          bs[2].pathlen = pAVar7;
        }
        BASIC_CONSTRAINTS_free((BASIC_CONSTRAINTS *)usage);
        bs[3].ca = bs[3].ca | 1;
      }
      extusage = (EXTENDED_KEY_USAGE *)
                 X509_get_ext_d2i((X509 *)bs,0x53,(int *)((long)&ex + 4),(int *)0x0);
      if ((ASN1_BIT_STRING *)extusage == (ASN1_BIT_STRING *)0x0) {
        if (ex._4_4_ != -1) {
          bs[3].ca = bs[3].ca | 0x80;
        }
      }
      else {
        if (((ASN1_BIT_STRING *)extusage)->length < 1) {
          *(undefined4 *)&bs[3].field_0x4 = 0;
        }
        else {
          *(uint *)&bs[3].field_0x4 = (uint)*((ASN1_BIT_STRING *)extusage)->data;
          if (1 < ((ASN1_BIT_STRING *)extusage)->length) {
            *(uint *)&bs[3].field_0x4 =
                 (uint)((ASN1_BIT_STRING *)extusage)->data[1] << 8 | *(uint *)&bs[3].field_0x4;
          }
        }
        bs[3].ca = bs[3].ca | 2;
        ASN1_BIT_STRING_free((ASN1_BIT_STRING *)extusage);
      }
      *(undefined4 *)&bs[3].pathlen = 0;
      i = (size_t)X509_get_ext_d2i((X509 *)bs,0x7e,(int *)((long)&ex + 4),(int *)0x0);
      if ((void *)i == (void *)0x0) {
        if (ex._4_4_ != -1) {
          bs[3].ca = bs[3].ca | 0x80;
        }
      }
      else {
        bs[3].ca = bs[3].ca | 4;
        for (_is_set = 0; uVar1 = _is_set, sVar5 = sk_ASN1_OBJECT_num((stack_st_ASN1_OBJECT *)i),
            uVar1 < sVar5; _is_set = _is_set + 1) {
          o = (ASN1_OBJECT *)sk_ASN1_OBJECT_value((stack_st_ASN1_OBJECT *)i,_is_set);
          iVar2 = OBJ_obj2nid(o);
          if (iVar2 == 0x81) {
            *(uint *)&bs[3].pathlen = *(uint *)&bs[3].pathlen | 1;
          }
          else if (iVar2 == 0x82) {
            *(uint *)&bs[3].pathlen = *(uint *)&bs[3].pathlen | 2;
          }
          else if (iVar2 == 0x83) {
            *(uint *)&bs[3].pathlen = *(uint *)&bs[3].pathlen | 8;
          }
          else if (iVar2 == 0x84) {
            *(uint *)&bs[3].pathlen = *(uint *)&bs[3].pathlen | 4;
          }
          else if (iVar2 == 0x85) {
            *(uint *)&bs[3].pathlen = *(uint *)&bs[3].pathlen | 0x40;
          }
          else if ((iVar2 == 0x89) || (iVar2 == 0x8b)) {
            *(uint *)&bs[3].pathlen = *(uint *)&bs[3].pathlen | 0x10;
          }
          else if (iVar2 == 0xb4) {
            *(uint *)&bs[3].pathlen = *(uint *)&bs[3].pathlen | 0x20;
          }
          else if (iVar2 == 0x129) {
            *(uint *)&bs[3].pathlen = *(uint *)&bs[3].pathlen | 0x80;
          }
          else if (iVar2 == 0x38e) {
            *(uint *)&bs[3].pathlen = *(uint *)&bs[3].pathlen | 0x100;
          }
        }
        sk_ASN1_OBJECT_pop_free((stack_st_ASN1_OBJECT *)i,ASN1_OBJECT_free);
      }
      pvVar6 = X509_get_ext_d2i((X509 *)bs,0x52,(int *)((long)&ex + 4),(int *)0x0);
      *(void **)(bs + 4) = pvVar6;
      if ((*(long *)(bs + 4) == 0) && (ex._4_4_ != -1)) {
        bs[3].ca = bs[3].ca | 0x80;
      }
      pAVar7 = (ASN1_INTEGER *)X509_get_ext_d2i((X509 *)bs,0x5a,(int *)((long)&ex + 4),(int *)0x0);
      bs[4].pathlen = pAVar7;
      if ((bs[4].pathlen == (ASN1_INTEGER *)0x0) && (ex._4_4_ != -1)) {
        bs[3].ca = bs[3].ca | 0x80;
      }
      a = X509_get_subject_name((X509 *)bs);
      b = X509_get_issuer_name((X509 *)bs);
      iVar2 = X509_NAME_cmp(a,b);
      if (iVar2 == 0) {
        bs[3].ca = bs[3].ca | 0x20;
        iVar2 = X509_check_akid((X509 *)bs,(AUTHORITY_KEYID *)bs[4].pathlen);
        if ((iVar2 == 0) && (((bs[3].ca & 2U) == 0 || ((*(uint *)&bs[3].field_0x4 & 4) != 0)))) {
          bs[3].ca = bs[3].ca | 0x2000;
        }
      }
      pAVar7 = (ASN1_INTEGER *)X509_get_ext_d2i((X509 *)bs,0x55,(int *)((long)&ex + 4),(int *)0x0);
      bs[5].pathlen = pAVar7;
      if ((bs[5].pathlen == (ASN1_INTEGER *)0x0) && (ex._4_4_ != -1)) {
        bs[3].ca = bs[3].ca | 0x80;
      }
      pvVar6 = X509_get_ext_d2i((X509 *)bs,0x29a,(int *)((long)&ex + 4),(int *)0x0);
      *(void **)(bs + 6) = pvVar6;
      if ((*(long *)(bs + 6) == 0) && (ex._4_4_ != -1)) {
        bs[3].ca = bs[3].ca | 0x80;
      }
      iVar2 = setup_crldp((X509 *)bs);
      if (iVar2 == 0) {
        bs[3].ca = bs[3].ca | 0x80;
      }
      for (ex._4_4_ = 0; iVar2 = ex._4_4_, iVar3 = X509_get_ext_count((X509 *)bs), iVar2 < iVar3;
          ex._4_4_ = ex._4_4_ + 1) {
        ex_00 = X509_get_ext((X509 *)bs,ex._4_4_);
        iVar2 = X509_EXTENSION_get_critical(ex_00);
        if ((iVar2 != 0) && (iVar2 = X509_supported_extension(ex_00), iVar2 == 0)) {
          bs[3].ca = bs[3].ca | 0x200;
          break;
        }
      }
      bs[3].ca = bs[3].ca | 0x100;
      CRYPTO_MUTEX_unlock_write((CRYPTO_MUTEX *)(bs + 9));
      x_local._4_4_ = (uint)((bs[3].ca & 0x80U) == 0);
    }
    else {
      CRYPTO_MUTEX_unlock_write((CRYPTO_MUTEX *)(bs + 9));
      x_local._4_4_ = (uint)((bs[3].ca & 0x80U) == 0);
    }
  }
  else {
    x_local._4_4_ = (uint)((bs[3].ca & 0x80U) == 0);
  }
  return x_local._4_4_;
}

Assistant:

int x509v3_cache_extensions(X509 *x) {
  BASIC_CONSTRAINTS *bs;
  ASN1_BIT_STRING *usage;
  EXTENDED_KEY_USAGE *extusage;
  size_t i;
  int j;

  CRYPTO_MUTEX_lock_read(&x->lock);
  const int is_set = x->ex_flags & EXFLAG_SET;
  CRYPTO_MUTEX_unlock_read(&x->lock);

  if (is_set) {
    return (x->ex_flags & EXFLAG_INVALID) == 0;
  }

  CRYPTO_MUTEX_lock_write(&x->lock);
  if (x->ex_flags & EXFLAG_SET) {
    CRYPTO_MUTEX_unlock_write(&x->lock);
    return (x->ex_flags & EXFLAG_INVALID) == 0;
  }

  if (!X509_digest(x, EVP_sha256(), x->cert_hash, NULL)) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  // V1 should mean no extensions ...
  if (X509_get_version(x) == X509_VERSION_1) {
    x->ex_flags |= EXFLAG_V1;
  }
  // Handle basic constraints
  if ((bs = reinterpret_cast<BASIC_CONSTRAINTS *>(
           X509_get_ext_d2i(x, NID_basic_constraints, &j, NULL)))) {
    if (bs->ca) {
      x->ex_flags |= EXFLAG_CA;
    }
    if (bs->pathlen) {
      if ((bs->pathlen->type == V_ASN1_NEG_INTEGER) || !bs->ca) {
        x->ex_flags |= EXFLAG_INVALID;
        x->ex_pathlen = 0;
      } else {
        // TODO(davidben): |ASN1_INTEGER_get| returns -1 on overflow,
        // which currently acts as if the constraint isn't present. This
        // works (an overflowing path length constraint may as well be
        // infinity), but Chromium's verifier simply treats values above
        // 255 as an error.
        x->ex_pathlen = ASN1_INTEGER_get(bs->pathlen);
      }
    } else {
      x->ex_pathlen = -1;
    }
    BASIC_CONSTRAINTS_free(bs);
    x->ex_flags |= EXFLAG_BCONS;
  } else if (j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  // Handle key usage
  if ((usage = reinterpret_cast<ASN1_BIT_STRING *>(
           X509_get_ext_d2i(x, NID_key_usage, &j, NULL)))) {
    if (usage->length > 0) {
      x->ex_kusage = usage->data[0];
      if (usage->length > 1) {
        x->ex_kusage |= usage->data[1] << 8;
      }
    } else {
      x->ex_kusage = 0;
    }
    x->ex_flags |= EXFLAG_KUSAGE;
    ASN1_BIT_STRING_free(usage);
  } else if (j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  x->ex_xkusage = 0;
  if ((extusage = reinterpret_cast<EXTENDED_KEY_USAGE *>(
           X509_get_ext_d2i(x, NID_ext_key_usage, &j, NULL)))) {
    x->ex_flags |= EXFLAG_XKUSAGE;
    for (i = 0; i < sk_ASN1_OBJECT_num(extusage); i++) {
      switch (OBJ_obj2nid(sk_ASN1_OBJECT_value(extusage, i))) {
        case NID_server_auth:
          x->ex_xkusage |= XKU_SSL_SERVER;
          break;

        case NID_client_auth:
          x->ex_xkusage |= XKU_SSL_CLIENT;
          break;

        case NID_email_protect:
          x->ex_xkusage |= XKU_SMIME;
          break;

        case NID_code_sign:
          x->ex_xkusage |= XKU_CODE_SIGN;
          break;

        case NID_ms_sgc:
        case NID_ns_sgc:
          x->ex_xkusage |= XKU_SGC;
          break;

        case NID_OCSP_sign:
          x->ex_xkusage |= XKU_OCSP_SIGN;
          break;

        case NID_time_stamp:
          x->ex_xkusage |= XKU_TIMESTAMP;
          break;

        case NID_dvcs:
          x->ex_xkusage |= XKU_DVCS;
          break;

        case NID_anyExtendedKeyUsage:
          x->ex_xkusage |= XKU_ANYEKU;
          break;
      }
    }
    sk_ASN1_OBJECT_pop_free(extusage, ASN1_OBJECT_free);
  } else if (j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }

  x->skid = reinterpret_cast<ASN1_OCTET_STRING *>(
      X509_get_ext_d2i(x, NID_subject_key_identifier, &j, NULL));
  if (x->skid == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  x->akid = reinterpret_cast<AUTHORITY_KEYID *>(
      X509_get_ext_d2i(x, NID_authority_key_identifier, &j, NULL));
  if (x->akid == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  // Does subject name match issuer ?
  if (!X509_NAME_cmp(X509_get_subject_name(x), X509_get_issuer_name(x))) {
    x->ex_flags |= EXFLAG_SI;
    // If SKID matches AKID also indicate self signed
    if (X509_check_akid(x, x->akid) == X509_V_OK &&
        !ku_reject(x, X509v3_KU_KEY_CERT_SIGN)) {
      x->ex_flags |= EXFLAG_SS;
    }
  }
  x->altname = reinterpret_cast<STACK_OF(GENERAL_NAME) *>(
      X509_get_ext_d2i(x, NID_subject_alt_name, &j, NULL));
  if (x->altname == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  x->nc = reinterpret_cast<NAME_CONSTRAINTS *>(
      X509_get_ext_d2i(x, NID_name_constraints, &j, NULL));
  if (x->nc == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  if (!setup_crldp(x)) {
    x->ex_flags |= EXFLAG_INVALID;
  }

  for (j = 0; j < X509_get_ext_count(x); j++) {
    const X509_EXTENSION *ex = X509_get_ext(x, j);
    if (!X509_EXTENSION_get_critical(ex)) {
      continue;
    }
    if (!X509_supported_extension(ex)) {
      x->ex_flags |= EXFLAG_CRITICAL;
      break;
    }
  }
  x->ex_flags |= EXFLAG_SET;

  CRYPTO_MUTEX_unlock_write(&x->lock);
  return (x->ex_flags & EXFLAG_INVALID) == 0;
}